

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Smf.cpp
# Opt level: O2

Smf * rlib::midi::Smf::fromStream(Smf *__return_storage_ptr__,istream *is)

{
  list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_> *this;
  ulong uVar1;
  bool bVar2;
  byte bVar3;
  uchar uVar4;
  array<unsigned_char,_2UL> aVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  uint64_t uVar9;
  ostream *poVar10;
  runtime_error *prVar11;
  long *plVar12;
  undefined8 uVar13;
  uint uVar14;
  ulong uVar15;
  char *pcVar16;
  byte bVar17;
  uint uVar18;
  uint uVar19;
  HeaderChunk HVar20;
  undefined1 auVar21 [12];
  undefined1 local_e8 [8];
  uint8_t n;
  undefined3 uStack_df;
  uint64_t currentPosition;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  exception_ptr ep;
  Track track;
  anon_class_8_1_3fcf65e8 readVariableValue;
  undefined1 local_40 [8];
  exception_ptr local_38;
  
  __return_storage_ptr__->timeBase = 0x1e0;
  this = &__return_storage_ptr__->tracks;
  (__return_storage_ptr__->tracks).
  super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)this;
  (__return_storage_ptr__->tracks).
  super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)this;
  (__return_storage_ptr__->tracks).
  super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>._M_impl._M_node.
  _M_size = 0;
  HVar20 = Inner::read<rlib::midi::Smf::Inner::HeaderChunk>(is);
  track.events._M_t._M_impl._0_8_ = HVar20._0_8_;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x66468544d;
  track.events._M_t._M_impl.super__Rb_tree_header._M_header._M_color = HVar20._8_4_;
  track.events._M_t._M_impl.super__Rb_tree_header._M_header._4_2_ = HVar20.division;
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish._6_2_ << 0x30);
  bVar2 = std::operator!=((array<unsigned_char,_4UL> *)&track,(array<unsigned_char,_4UL> *)&data);
  if (bVar2) {
    prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar11,"MThd chunk error");
    __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Inner::changeEndian<unsigned_int>((uint *)&track.events._M_t._M_impl.field_0x4);
  Inner::changeEndian<unsigned_short>
            ((unsigned_short *)&track.events._M_t._M_impl.super__Rb_tree_header);
  Inner::changeEndian<unsigned_short>
            ((unsigned_short *)
             ((long)&track.events._M_t._M_impl.super__Rb_tree_header._M_header._M_color + 2));
  Inner::changeEndian<unsigned_short>
            ((unsigned_short *)&track.events._M_t._M_impl.super__Rb_tree_header._M_header.field_0x4)
  ;
  ep._M_exception_object = (void *)0x0;
  __return_storage_ptr__->timeBase =
       (uint)(ushort)track.events._M_t._M_impl.super__Rb_tree_header._M_header._4_2_;
  uVar14 = track.events._M_t._M_impl.super__Rb_tree_header._M_header._M_color >> 0x10;
  uVar15 = 0;
  do {
    if (uVar15 == uVar14) {
      if (ep._M_exception_object != (void *)0x0) {
        std::__exception_ptr::exception_ptr::exception_ptr(&local_38,&ep);
        auVar21 = std::rethrow_exception((exception_ptr)&local_38);
        std::__exception_ptr::exception_ptr::~exception_ptr(&local_38);
        plVar12 = (long *)__cxa_begin_catch(auVar21._0_8_);
        if (auVar21._8_4_ == 2) {
          poVar10 = std::operator<<((ostream *)&std::clog,"[warning] exception: ");
          pcVar16 = (char *)(**(code **)(*plVar12 + 0x10))(plVar12);
          poVar10 = std::operator<<(poVar10,pcVar16);
          std::endl<char,std::char_traits<char>>(poVar10);
          __cxa_end_catch();
        }
        else {
          poVar10 = std::operator<<((ostream *)&std::clog,"[warning] exception unknwon");
          std::endl<char,std::char_traits<char>>(poVar10);
          __cxa_end_catch();
        }
        if ((__return_storage_ptr__->tracks).
            super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>.
            _M_impl._M_node._M_size == 0) {
          std::__exception_ptr::exception_ptr::exception_ptr((exception_ptr *)local_40,&ep);
          uVar13 = std::rethrow_exception((exception_ptr)local_40);
          std::__exception_ptr::exception_ptr::~exception_ptr(&ep);
          std::__cxx11::_List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>
          ::_M_clear(&this->
                      super__List_base<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>
                    );
          _Unwind_Resume(uVar13);
        }
      }
      std::__exception_ptr::exception_ptr::~exception_ptr(&ep);
      return __return_storage_ptr__;
    }
    track.events._M_t._M_impl._0_8_ = Inner::read<rlib::midi::Smf::Inner::TrackChunk>(is);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x6b72544d;
    bVar2 = std::operator!=((array<unsigned_char,_4UL> *)&track,
                            (array<unsigned_char,_4UL> *)
                            &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
    ;
    if (bVar2) {
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"MTrk chunk error.");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    Inner::changeEndian<unsigned_int>((uint *)&track.events._M_t._M_impl.field_0x4);
    uVar1 = (ulong)track.events._M_t._M_impl._0_8_ >> 0x20;
    track.events._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    track.events._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    track.events._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &track.events._M_t._M_impl.super__Rb_tree_header._M_header;
    track.events._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    currentPosition = 0;
    track.events._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         track.events._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    lVar7 = std::istream::tellg();
    bVar17 = 0;
LAB_00149788:
    while (lVar8 = std::istream::tellg(), lVar8 - lVar7 < (long)uVar1) {
      readVariableValue.is = is;
      uVar9 = fromStream::anon_class_8_1_3fcf65e8::operator()(&readVariableValue);
      currentPosition = currentPosition + uVar9;
      bVar3 = Inner::read<unsigned_char_const>(is);
      if (-1 < (char)bVar3) {
        std::istream::seekg((long)is,~_S_beg);
        bVar3 = bVar17;
      }
      uVar6 = bVar3 - 0x80 >> 4;
      uVar18 = (uint)bVar3;
      bVar17 = bVar3;
      if (6 < uVar6) {
        if (bVar3 != 0xff) goto code_r0x00149941;
        bVar3 = Inner::read<unsigned_char_const>(is);
        uVar9 = fromStream::anon_class_8_1_3fcf65e8::operator()(&readVariableValue);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,uVar9,
                   (allocator_type *)&n);
        lVar8 = std::istream::read((char *)is,
                                   (long)data.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
        if ((long)*(size_type *)(lVar8 + 8) <
            (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                     *(size_type *)(lVar8 + 8));
          poVar10 = std::operator<<((ostream *)&std::clog,"[warning] meta data size error.");
          std::endl<char,std::char_traits<char>>(poVar10);
        }
        local_e8._0_4_ = ZEXT14(bVar3);
        std::
        make_shared<rlib::midi::EventMeta,rlib::midi::EventMeta::Type,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((Type *)&n,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_e8);
        std::
        _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
        ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventMeta>>
                  ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    *)&track,&currentPosition,(shared_ptr<rlib::midi::EventMeta> *)&n);
        goto LAB_00149b81;
      }
      uVar19 = (uint)bVar3;
      switch(uVar6) {
      case 0:
        aVar5 = Inner::read<std::array<unsigned_char,2ul>const>(is);
        _n = uVar19 & 0xf;
        local_e8._0_4_ = (ushort)aVar5._M_elems & 0x7f;
        local_e8._4_4_ = aVar5._M_elems[1] & 0x7f;
        std::make_shared<rlib::midi::EventNoteOff,int,int,int>
                  ((int *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                   (int *)&n,(int *)local_e8);
        std::
        _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
        ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventNoteOff>>
                  ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    *)&track,&currentPosition,
                   (shared_ptr<rlib::midi::EventNoteOff> *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        break;
      case 1:
        aVar5 = Inner::read<std::array<unsigned_char,2ul>const>(is);
        _n = uVar19 & 0xf;
        local_e8._0_4_ = (ushort)aVar5._M_elems & 0x7f;
        local_e8._4_4_ = aVar5._M_elems[1] & 0x7f;
        std::make_shared<rlib::midi::EventNoteOn,int,int,int>
                  ((int *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                   (int *)&n,(int *)local_e8);
        std::
        _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
        ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventNoteOn>>
                  ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    *)&track,&currentPosition,
                   (shared_ptr<rlib::midi::EventNoteOn> *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        break;
      case 2:
        aVar5 = Inner::read<std::array<unsigned_char,2ul>const>(is);
        _n = uVar19 & 0xf;
        local_e8._0_4_ = (ushort)aVar5._M_elems & 0x7f;
        local_e8._4_4_ = aVar5._M_elems[1] & 0x7f;
        std::make_shared<rlib::midi::EventPolyphonicKeyPressure,int,int,int>
                  ((int *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                   (int *)&n,(int *)local_e8);
        std::
        _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
        ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventPolyphonicKeyPressure>>
                  ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    *)&track,&currentPosition,
                   (shared_ptr<rlib::midi::EventPolyphonicKeyPressure> *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        break;
      case 3:
        aVar5 = Inner::read<std::array<unsigned_char,2ul>const>(is);
        _n = uVar19 & 0xf;
        local_e8._0_4_ = (ushort)aVar5._M_elems & 0x7f;
        local_e8._4_4_ = aVar5._M_elems[1] & 0x7f;
        std::make_shared<rlib::midi::EventControlChange,int,int,int>
                  ((int *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                   (int *)&n,(int *)local_e8);
        std::
        _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
        ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventControlChange>>
                  ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    *)&track,&currentPosition,
                   (shared_ptr<rlib::midi::EventControlChange> *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        break;
      case 4:
        bVar3 = Inner::read<unsigned_char_const>(is);
        _n = uVar18 & 0xf;
        local_e8._0_4_ = ZEXT14(bVar3 & 0x7f);
        std::make_shared<rlib::midi::EventProgramChange,int,int>
                  ((int *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                   (int *)&n);
        std::
        _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
        ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventProgramChange>>
                  ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    *)&track,&currentPosition,
                   (shared_ptr<rlib::midi::EventProgramChange> *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        break;
      case 5:
        bVar3 = Inner::read<unsigned_char_const>(is);
        _n = uVar18 & 0xf;
        local_e8._0_4_ = ZEXT14(bVar3 & 0x7f);
        std::make_shared<rlib::midi::EventChannelPressure,int,int>
                  ((int *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                   (int *)&n);
        std::
        _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
        ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventChannelPressure>>
                  ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    *)&track,&currentPosition,
                   (shared_ptr<rlib::midi::EventChannelPressure> *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        break;
      case 6:
        aVar5 = Inner::read<std::array<unsigned_char,2ul>const>(is);
        _n = ((ushort)aVar5._M_elems >> 1 & 0x3f80 | (ushort)aVar5._M_elems & 0x7f) - 0x2000;
        local_e8._0_4_ = uVar18 & 0xf;
        std::make_shared<rlib::midi::EventPitchBend,int,int_const&>
                  ((int *)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                   (int *)local_e8);
        std::
        _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
        ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventPitchBend>>
                  ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                    *)&track,&currentPosition,
                   (shared_ptr<rlib::midi::EventPitchBend> *)
                   &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    }
    std::__cxx11::list<rlib::midi::Smf::Track,_std::allocator<rlib::midi::Smf::Track>_>::
    emplace_back<rlib::midi::Smf::Track>(this,&track);
    std::
    _Rb_tree<rlib::midi::Smf::Event,_rlib::midi::Smf::Event,_std::_Identity<rlib::midi::Smf::Event>,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
    ::~_Rb_tree((_Rb_tree<rlib::midi::Smf::Event,_rlib::midi::Smf::Event,_std::_Identity<rlib::midi::Smf::Event>,_rlib::midi::Smf::Event::Less,_std::allocator<rlib::midi::Smf::Event>_>
                 *)&track);
    uVar15 = uVar15 + 1;
  } while( true );
code_r0x00149941:
  if (uVar18 == 0xf0) {
    uVar9 = fromStream::anon_class_8_1_3fcf65e8::operator()(&readVariableValue);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    while (uVar9 != 0) {
      uVar4 = Inner::read<unsigned_char_const>(is);
      _n = CONCAT31(uStack_df,uVar4);
      if (uVar4 == 0xf7) {
        pcVar16 = "[warning] exclusive size error. EOX(0xf7) is failed position.";
        if (uVar9 != 1) {
LAB_00149b4b:
          poVar10 = std::operator<<((ostream *)&std::clog,pcVar16);
          std::endl<char,std::char_traits<char>>(poVar10);
        }
        break;
      }
      if ((char)uVar4 < '\0') {
        pcVar16 = "[warning] exclusive data error. EOX(0xf7) is missing.";
        goto LAB_00149b4b;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,&n);
      uVar9 = uVar9 - 1;
    }
    std::
    make_shared<rlib::midi::EventExclusive,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&n);
    std::
    _Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
    ::_M_emplace_equal<unsigned_long&,std::shared_ptr<rlib::midi::EventExclusive>>
              ((_Rb_tree<rlib::midi::Smf::Event,rlib::midi::Smf::Event,std::_Identity<rlib::midi::Smf::Event>,rlib::midi::Smf::Event::Less,std::allocator<rlib::midi::Smf::Event>>
                *)&track,&currentPosition,(shared_ptr<rlib::midi::EventExclusive> *)&n);
LAB_00149b81:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff28);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  goto LAB_00149788;
}

Assistant:

Smf Smf::fromStream(std::istream& is)
{
	using namespace midi;

	Smf smf;

	const auto headerChunk = [&is]() {
		Inner::HeaderChunk c = Inner::read<decltype(c)>(is);
		if (c.MThd != Inner::HeaderChunk().MThd) {
			throw std::runtime_error("MThd chunk error");
		}
		Inner::changeEndian(c.dataLength);
		Inner::changeEndian(c.format);
		Inner::changeEndian(c.trackCount);
		Inner::changeEndian(c.division);
		return c;
	}();

	smf.timeBase = headerChunk.division;

	// トラックチャンク
	std::exception_ptr ep;	// 例外保持
	try {
		for (size_t i = 0; i < headerChunk.trackCount; i++) {
			const auto trackChunk = [&is]() {
				Inner::TrackChunk c = Inner::read<decltype(c)>(is);
				if (c.MTrk != Inner::TrackChunk().MTrk) {
					throw std::runtime_error("MTrk chunk error.");
				}
				Inner::changeEndian(c.dataLength);
				return c;
			}();

			Smf::Track track;
			try{
				std::uint64_t currentPosition = 0;		// 現在位置
				uint8_t beforeStatus = 0;
				for (const auto beginPosition = is.tellg(); is.tellg() - beginPosition < trackChunk.dataLength; ) {
					auto readVariableValue = [&is] {					// 可変長数値を取得
						return inner::readVariableValue([&] {return Inner::read<uint8_t>(is); });
					};

					currentPosition += readVariableValue();		// 現在位置 += デルタタイム

					// status 読み込み
					const auto status = [&] {
						const uint8_t status = Inner::read<decltype(status)>(is);
						if (!(status & 0x80)) {					// status 省略なら直前値を採用
							is.seekg(-1, std::ios::cur);		// 位置を戻す
							return beforeStatus;
						}
						beforeStatus = status;
						return status;
					}();

					switch (status & 0xf0) {
					case EventNoteOff::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventNoteOff>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventNoteOn::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventNoteOn>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventPolyphonicKeyPressure::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventPolyphonicKeyPressure>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventControlChange::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventControlChange>(status & 0xf, a[0] & 0x7f, a[1] & 0x7f));
						break;
					}
					case EventProgramChange::statusByte: {
						const uint8_t n = Inner::read<decltype(n)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventProgramChange>(status & 0xf, n & 0x7f));
						break;
					}
					case EventPitchBend::statusByte: {
						const std::array<uint8_t, 2> a = Inner::read<decltype(a)>(is);
						const auto n = ((a[0] & 0x7f) + (a[1] & 0x7f) * 0x80) - 8192;
						track.events.emplace(currentPosition, std::make_shared<EventPitchBend>(status & 0xf, n));
						break;
					}
					case EventChannelPressure::statusByte: {
						const uint8_t n = Inner::read<decltype(n)>(is);
						track.events.emplace(currentPosition, std::make_shared<EventChannelPressure>(status & 0xf, n & 0x7f));
						break;
					}
					default:
						switch (status) {
						case EventExclusive::statusByte: {
							const auto size = readVariableValue();		// データ長
							std::vector<uint8_t> data;
							for (auto i = 0; i < size; i++) {
								const uint8_t n = Inner::read<decltype(n)>(is);
								if (n == 0xf7) {				// EOX(終了コード)
									if (i != size - 1) {
										// ヘンなところで終わった(が、エラーにはせず続行)
										std::clog << "[warning] exclusive size error. EOX(0xf7) is failed position." << std::endl;	// throw std::runtime_error("exclusive size error");
										break;
									}
									break;
								}
								if ((n & 0x80) != 0) {
									// あるべきハズのEOX(0xf7)が無い(が、エラーにはせず続行)
									std::clog << "[warning] exclusive data error. EOX(0xf7) is missing." << std::endl;
									break;
								}
								data.push_back(n);
							}
							track.events.emplace(currentPosition, std::make_shared<EventExclusive>(std::move(data)));
							break;
						}
						case EventMeta::statusByte: {
							const uint8_t type = Inner::read<decltype(type)>(is);					// イベントタイプ
							const auto len = readVariableValue();									// データ長
							std::vector<uint8_t> data(len);
							if (const auto readed = is.read(reinterpret_cast<char*>(data.data()), data.size()).gcount(); readed < static_cast<std::intmax_t>(data.size())) {
								data.resize(readed);
								// データが足りない(が、エラーにはせず続行)
								std::clog << "[warning] meta data size error." << std::endl;
							}
							track.events.emplace(currentPosition, std::make_shared<EventMeta>(static_cast<EventMeta::Type>(type), std::move(data)));
							break;
						}
						default:
							assert(false);
							break;
						}
					}
				}
			} catch (...) {
				if (track.events.size() > 0) {
					smf.tracks.emplace_back(std::move(track));
				}
				throw;
			}
			smf.tracks.emplace_back(std::move(track));
		}
	} catch (...) {
		ep = std::current_exception();
	}
	if (ep) {
		try {
			std::rethrow_exception(ep);
		} catch (const std::exception& e) {
			std::clog << "[warning] exception: " << e.what() << std::endl;
		} catch (...) {
			std::clog << "[warning] exception unknwon" << std::endl;
		}
		if (smf.tracks.size() <= 0) {	// トラックがまったくパースできてない状態なら
			std::rethrow_exception(ep);	// throw で終了
		}
	}
	return smf;
}